

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::validateBuiltinArgs
          (Interpreter *this,LocationRange *loc,string *name,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args,vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                *params)

{
  Type TVar1;
  ulong uVar2;
  bool bVar3;
  char *__lhs;
  char *pcVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  reference pTVar8;
  reference pVVar9;
  ostream *poVar10;
  LocationRange *loc_00;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RCX;
  Interpreter *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  Value a;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *__range3_1;
  Type p;
  const_iterator __end3;
  const_iterator __begin3;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *__range3;
  char *prefix;
  stringstream ss;
  size_t i;
  string *in_stack_fffffffffffffce8;
  __normal_iterator<const_jsonnet::internal::(anonymous_namespace)::Value_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_>
  *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  Type in_stack_fffffffffffffd4c;
  string local_298 [32];
  undefined8 local_278;
  anon_union_8_3_4e909c26_for_v aStack_270;
  Value *local_268;
  __normal_iterator<const_jsonnet::internal::(anonymous_namespace)::Value_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_>
  local_260;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_258;
  string local_250 [36];
  Type local_22c;
  Type *local_228;
  __normal_iterator<const_jsonnet::internal::(anonymous_namespace)::Value::Type_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>_>
  local_220 [2];
  char *local_210;
  string local_1f8 [32];
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  ulong local_30;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_20;
  Interpreter *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  __lhs = (char *)std::
                  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                  ::size(in_RCX);
  pcVar4 = (char *)std::
                   vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                   ::size((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                           *)in_R8);
  if (__lhs == pcVar4) {
    local_30 = 0;
    while( true ) {
      uVar2 = local_30;
      sVar5 = std::
              vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
              ::size(local_20);
      if (sVar5 <= uVar2) {
        return;
      }
      pvVar6 = std::
               vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
               ::operator[](local_20,local_30);
      TVar1 = pvVar6->t;
      pvVar7 = std::
               vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
               ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                             *)in_R8,local_30);
      if (TVar1 != *pvVar7) break;
      local_30 = local_30 + 1;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator+(__lhs,in_R8);
  std::operator+(in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
  std::operator<<(local_1a8,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_1f8);
  local_210 = "";
  local_220[0]._M_current =
       (Type *)std::
               vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
               ::begin((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                        *)in_stack_fffffffffffffce8);
  local_228 = (Type *)std::
                      vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                      ::end((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                             *)in_stack_fffffffffffffce8);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_jsonnet::internal::(anonymous_namespace)::Value::Type_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>_>
                             *)in_stack_fffffffffffffcf0,
                            (__normal_iterator<const_jsonnet::internal::(anonymous_namespace)::Value::Type_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>_>
                             *)in_stack_fffffffffffffce8), bVar3) {
    pTVar8 = __gnu_cxx::
             __normal_iterator<const_jsonnet::internal::(anonymous_namespace)::Value::Type_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>_>
             ::operator*(local_220);
    local_22c = *pTVar8;
    poVar10 = std::operator<<(local_1a8,local_210);
    (anonymous_namespace)::type_str_abi_cxx11_(in_stack_fffffffffffffd4c);
    std::operator<<(poVar10,local_250);
    std::__cxx11::string::~string(local_250);
    local_210 = ", ";
    __gnu_cxx::
    __normal_iterator<const_jsonnet::internal::(anonymous_namespace)::Value::Type_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>_>
    ::operator++(local_220);
  }
  std::operator<<(local_1a8,") but got (");
  local_210 = "";
  local_258 = local_20;
  local_260._M_current =
       (Value *)std::
                vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                ::begin((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)in_stack_fffffffffffffce8);
  local_268 = (Value *)std::
                       vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                       ::end((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                              *)in_stack_fffffffffffffce8);
  while (bVar3 = __gnu_cxx::operator!=
                           (in_stack_fffffffffffffcf0,
                            (__normal_iterator<const_jsonnet::internal::(anonymous_namespace)::Value_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_>
                             *)in_stack_fffffffffffffce8), bVar3) {
    pVVar9 = __gnu_cxx::
             __normal_iterator<const_jsonnet::internal::(anonymous_namespace)::Value_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_>
             ::operator*(&local_260);
    local_278 = *(undefined8 *)pVVar9;
    aStack_270 = pVVar9->v;
    poVar10 = std::operator<<(local_1a8,local_210);
    (anonymous_namespace)::type_str_abi_cxx11_((Value *)in_stack_fffffffffffffce8);
    std::operator<<(poVar10,local_298);
    std::__cxx11::string::~string(local_298);
    local_210 = ", ";
    __gnu_cxx::
    __normal_iterator<const_jsonnet::internal::(anonymous_namespace)::Value_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_>
    ::operator++(&local_260);
  }
  std::operator<<(local_1a8,")");
  loc_00 = (LocationRange *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  makeError(local_10,loc_00,in_stack_fffffffffffffce8);
  __cxa_throw(loc_00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

void validateBuiltinArgs(const LocationRange &loc, const std::string &name,
                             const std::vector<Value> &args, const std::vector<Value::Type> params)
    {
        if (args.size() == params.size()) {
            for (std::size_t i = 0; i < args.size(); ++i) {
                if (args[i].t != params[i])
                    goto bad;
            }
            return;
        }
    bad:;
        std::stringstream ss;
        ss << "Builtin function " + name + " expected (";
        const char *prefix = "";
        for (auto p : params) {
            ss << prefix << type_str(p);
            prefix = ", ";
        }
        ss << ") but got (";
        prefix = "";
        for (auto a : args) {
            ss << prefix << type_str(a);
            prefix = ", ";
        }
        ss << ")";
        throw makeError(loc, ss.str());
    }